

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void piweight(double *phi,double *theta,double *piw,int p,int q,int j)

{
  void *__ptr;
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  *piw = 1.0;
  __ptr = malloc((long)p * 8 + 8);
  if (0 < p) {
    memcpy((void *)((long)__ptr + 8),phi,(ulong)(uint)p << 3);
  }
  if (1 < j) {
    uVar1 = 1;
    lVar2 = 0;
    do {
      piw[uVar1] = 0.0;
      dVar5 = 0.0;
      dVar6 = 0.0;
      if ((long)uVar1 <= (long)p) {
        dVar6 = -*(double *)((long)__ptr + uVar1 * 8);
        piw[uVar1] = dVar6;
      }
      if (0 < q) {
        lVar3 = 0;
        lVar4 = lVar2;
        do {
          if (-1 < lVar4) {
            dVar5 = dVar5 + theta[lVar3] * piw[lVar4];
          }
          lVar4 = lVar4 + -1;
          lVar3 = lVar3 + 1;
        } while ((ulong)(q + 1) - 1 != lVar3);
      }
      piw[uVar1] = dVar6 - dVar5;
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)j);
  }
  free(__ptr);
  return;
}

Assistant:

void piweight(double *phi,double *theta,double *piw,int p,int q,int j) {
	int i,k;
	double temp;
	double *ph;
	piw[0] = 1.0;
	ph = (double*) malloc(sizeof(double) * (p+1));	
	ph[0] = -1.;
	for(i = 0; i < p;++i) {
		ph[i+1] = phi[i];
	}
	
	for(i = 1; i < j;++i) {
		piw[i] = 0.0;
		temp = 0.0;
		if(i <= p) {
			piw[i] = -ph[i];
		}
		for(k = 1; k < q+1;++k) {
			if((i - k) >= 0) {
				temp+=theta[k-1] * piw[i-k];
			} 
			
		}
		piw[i] -= temp;
	}
	
	free(ph);
	
}